

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,StringTree *params,
          StringTree *params_1,ArrayPtr<const_char> *params_2,ArrayPtr<const_char> *params_3,
          ArrayPtr<const_char> *params_4,ArrayPtr<const_char> *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7,
          ArrayPtr<const_char> *params_8,CappedArray<char,_14UL> *params_9,
          ArrayPtr<const_char> *params_10,StringTree *params_11,ArrayPtr<const_char> *params_12,
          ArrayPtr<const_char> *params_13,ArrayPtr<const_char> *params_14,
          ArrayPtr<const_char> *params_15,ArrayPtr<const_char> *params_16,
          ArrayPtr<const_char> *params_17,ArrayPtr<const_char> *params_18,
          CappedArray<char,_14UL> *params_19,ArrayPtr<const_char> *params_20,StringTree *params_21,
          ArrayPtr<const_char> *params_22,ArrayPtr<const_char> *params_23,
          ArrayPtr<const_char> *params_24,ArrayPtr<const_char> *params_25,
          ArrayPtr<const_char> *params_26,ArrayPtr<const_char> *params_27,
          ArrayPtr<const_char> *params_28,CappedArray<char,_14UL> *params_29,
          ArrayPtr<const_char> *params_30,StringTree *params_31,ArrayPtr<const_char> *params_32,
          ArrayPtr<const_char> *params_33,ArrayPtr<const_char> *params_34,
          ArrayPtr<const_char> *params_35,ArrayPtr<const_char> *params_36,
          ArrayPtr<const_char> *params_37,ArrayPtr<const_char> *params_38,
          CappedArray<char,_14UL> *params_39,ArrayPtr<const_char> *params_40,StringTree *params_41,
          ArrayPtr<const_char> *params_42,ArrayPtr<const_char> *params_43,
          ArrayPtr<const_char> *params_44,ArrayPtr<const_char> *params_45,
          ArrayPtr<const_char> *params_46,ArrayPtr<const_char> *params_47,
          ArrayPtr<const_char> *params_48,CappedArray<char,_14UL> *params_49,
          ArrayPtr<const_char> *params_50)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  size_t sVar3;
  Branch *pBVar4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  size_t result_2;
  String local_310;
  size_t local_2f8 [2];
  char *local_2e8;
  size_t sStack_2e0;
  size_t local_2d8;
  size_t sStack_2d0;
  size_t local_2c8;
  size_t sStack_2c0;
  size_t local_2b8;
  char *pcStack_2b0;
  undefined8 local_2a8;
  char *local_2a0;
  char *local_298;
  size_t sStack_290;
  size_t local_288;
  size_t sStack_280;
  size_t local_278;
  size_t sStack_270;
  size_t local_268;
  char *pcStack_260;
  undefined8 local_258;
  char *local_250;
  char *local_248;
  size_t sStack_240;
  size_t local_238;
  size_t sStack_230;
  size_t local_228;
  size_t sStack_220;
  size_t local_218;
  char *pcStack_210;
  undefined8 local_208;
  char *local_200;
  char *local_1f8;
  size_t sStack_1f0;
  size_t local_1e8;
  size_t sStack_1e0;
  size_t local_1d8;
  size_t sStack_1d0;
  size_t local_1c8;
  char *pcStack_1c0;
  undefined8 local_1b8;
  char *local_1b0;
  char *local_1a8;
  size_t sStack_1a0;
  size_t local_198;
  size_t sStack_190;
  size_t local_188;
  size_t sStack_180;
  size_t local_178;
  char *pcStack_170;
  undefined8 local_168;
  StringTree *local_160;
  StringTree *local_158;
  StringTree *local_150;
  ArrayPtr<const_char> *local_148;
  ArrayPtr<const_char> *local_140;
  size_t local_138;
  size_t local_130;
  size_t local_128;
  size_t local_120;
  size_t local_118;
  char *local_110;
  undefined8 local_108;
  char *local_100;
  size_t local_f8;
  size_t local_f0;
  size_t local_e8;
  size_t local_e0;
  size_t local_d8;
  size_t local_d0;
  char *local_c8;
  undefined8 local_c0;
  char *local_b8;
  size_t local_b0;
  size_t local_a8;
  size_t local_a0;
  size_t local_98;
  size_t local_90;
  size_t local_88;
  char *local_80;
  undefined8 local_78;
  char *local_70;
  size_t local_68;
  size_t local_60;
  size_t local_58;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  char *local_38;
  
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  local_2f8[0] = this->size_;
  local_2f8[1] = params->size_;
  local_38 = (params_1->text).content.ptr;
  local_2e8 = local_38;
  local_40 = params_2->size_;
  sStack_2e0 = local_40;
  local_48 = params_3->size_;
  local_2d8 = local_48;
  local_50 = params_4->size_;
  sStack_2d0 = local_50;
  local_58 = params_5->size_;
  local_2c8 = local_58;
  local_60 = params_6->size_;
  sStack_2c0 = local_60;
  local_68 = params_7->size_;
  local_2b8 = local_68;
  local_70 = params_8->ptr;
  pcStack_2b0 = local_70;
  local_78 = *(undefined8 *)params_9->content;
  local_2a8 = local_78;
  local_2a0 = params_10->ptr;
  local_80 = (params_11->text).content.ptr;
  local_298 = local_80;
  local_88 = params_12->size_;
  sStack_290 = local_88;
  local_90 = params_13->size_;
  local_288 = local_90;
  local_98 = params_14->size_;
  sStack_280 = local_98;
  local_a0 = params_15->size_;
  local_278 = local_a0;
  local_a8 = params_16->size_;
  sStack_270 = local_a8;
  local_b0 = params_17->size_;
  local_268 = local_b0;
  local_b8 = params_18->ptr;
  pcStack_260 = local_b8;
  local_c0 = *(undefined8 *)params_19->content;
  local_258 = local_c0;
  local_250 = params_20->ptr;
  local_c8 = (params_21->text).content.ptr;
  local_248 = local_c8;
  local_d0 = params_22->size_;
  sStack_240 = local_d0;
  local_d8 = params_23->size_;
  local_238 = local_d8;
  local_e0 = params_24->size_;
  sStack_230 = local_e0;
  local_e8 = params_25->size_;
  local_228 = local_e8;
  local_f0 = params_26->size_;
  sStack_220 = local_f0;
  local_f8 = params_27->size_;
  local_218 = local_f8;
  local_100 = params_28->ptr;
  pcStack_210 = local_100;
  local_108 = *(undefined8 *)params_29->content;
  local_208 = local_108;
  local_200 = params_30->ptr;
  local_110 = (params_31->text).content.ptr;
  local_1f8 = local_110;
  local_118 = params_32->size_;
  sStack_1f0 = local_118;
  local_120 = params_33->size_;
  local_1e8 = local_120;
  local_128 = params_34->size_;
  sStack_1e0 = local_128;
  local_130 = params_35->size_;
  local_1d8 = local_130;
  local_138 = params_36->size_;
  sStack_1d0 = local_138;
  local_1c8 = params_37->size_;
  pcStack_1c0 = params_38->ptr;
  local_1b8 = *(undefined8 *)params_39->content;
  local_1b0 = params_40->ptr;
  local_1a8 = (params_41->text).content.ptr;
  sStack_1a0 = params_42->size_;
  local_198 = params_43->size_;
  sStack_190 = params_44->size_;
  local_188 = params_45->size_;
  sStack_180 = params_46->size_;
  local_178 = params_47->size_;
  pcStack_170 = params_48->ptr;
  local_168 = *(undefined8 *)params_49->content;
  sVar5 = 0;
  lVar7 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)local_2f8 + lVar7);
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x198);
  __return_storage_ptr__->size_ = sVar5;
  local_2f8[0] = 0;
  local_2f8[1] = 0;
  sVar5 = 0;
  local_2a0 = (char *)0x0;
  local_250 = (char *)0x0;
  local_200 = (char *)0x0;
  local_1b0 = (char *)0x0;
  lVar7 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)local_2f8 + lVar7);
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x198);
  local_160 = this;
  local_158 = params;
  local_150 = params_1;
  local_148 = params_3;
  local_140 = params_2;
  heapString(&local_310,sVar5);
  pcVar6 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar6 != (char *)0x0) {
    sVar5 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar1 = (__return_storage_ptr__->text).content.disposer;
    (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar6,1,sVar5,sVar5,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_310.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_310.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_310.content.disposer;
  local_2f8[0] = 1;
  local_2f8[1] = 1;
  local_2e8 = (char *)0x0;
  sStack_2e0 = 0;
  local_2d8 = 0;
  sStack_2d0 = 0;
  local_2c8 = 0;
  sStack_2c0 = 0;
  local_2b8 = 0;
  pcStack_2b0 = (char *)0x0;
  sVar5 = 0;
  local_2a8 = 0;
  local_2a0 = (char *)0x1;
  local_298 = (char *)0x0;
  sStack_290 = 0;
  local_288 = 0;
  sStack_280 = 0;
  local_278 = 0;
  sStack_270 = 0;
  local_268 = 0;
  pcStack_260 = (char *)0x0;
  local_258 = 0;
  local_250 = (char *)0x1;
  local_248 = (char *)0x0;
  sStack_240 = 0;
  local_238 = 0;
  sStack_230 = 0;
  local_228 = 0;
  sStack_220 = 0;
  local_218 = 0;
  pcStack_210 = (char *)0x0;
  local_208 = 0;
  local_200 = (char *)0x1;
  local_1b8 = 0;
  local_1c8 = 0;
  pcStack_1c0 = (char *)0x0;
  local_1d8 = 0;
  sStack_1d0 = 0;
  local_1e8 = 0;
  sStack_1e0 = 0;
  local_1f8 = (char *)0x0;
  sStack_1f0 = 0;
  local_1b0 = (char *)0x1;
  local_168 = 0;
  local_178 = 0;
  pcStack_170 = (char *)0x0;
  local_188 = 0;
  sStack_180 = 0;
  local_198 = 0;
  sStack_190 = 0;
  local_1a8 = (char *)0x0;
  sStack_1a0 = 0;
  lVar7 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)local_2f8 + lVar7);
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x198);
  pBVar4 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,sVar5,sVar5,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      construct,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      destruct);
  local_310.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_310.content.ptr = (char *)pBVar4;
  local_310.content.size_ = sVar5;
  if (pBVar2 != (Branch *)0x0) {
    sVar3 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar1 = (__return_storage_ptr__->branches).disposer;
    (**pAVar1->_vptr_ArrayDisposer)
              (pAVar1,pBVar2,0x40,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = pBVar4;
  (__return_storage_ptr__->branches).size_ = sVar5;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pcVar6 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar6 != (char *)0x0) {
    pcVar6 = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pcVar6,0,local_160,local_158,(ArrayPtr<const_char> *)local_150,
             local_140,local_148,params_4,params_5,params_6,params_7,
             (CappedArray<char,_14UL> *)params_8,(ArrayPtr<const_char> *)params_9,
             (StringTree *)params_10,(ArrayPtr<const_char> *)params_11,params_12,params_13,params_14
             ,params_15,params_16,params_17,(CappedArray<char,_14UL> *)params_18,
             (ArrayPtr<const_char> *)params_19,(StringTree *)params_20,
             (ArrayPtr<const_char> *)params_21,params_22,params_23,params_24,params_25,params_26,
             params_27,(CappedArray<char,_14UL> *)params_28,(ArrayPtr<const_char> *)params_29,
             (StringTree *)params_30,(ArrayPtr<const_char> *)params_31,params_32,params_33,params_34
             ,params_35,params_36,params_37,(CappedArray<char,_14UL> *)params_38,
             (ArrayPtr<const_char> *)params_39,(StringTree *)params_40,
             (ArrayPtr<const_char> *)params_41,params_42,params_43,params_44,params_45,params_46,
             params_47,(CappedArray<char,_14UL> *)params_48,(ArrayPtr<const_char> *)params_49);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}